

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderConstValue(xmlTextReaderPtr reader)

{
  xmlElementType xVar1;
  _xmlNode *p_Var2;
  xmlChar *pxVar3;
  xmlBufPtr pxVar4;
  xmlNodePtr cur;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return (xmlChar *)0x0;
  }
  if (reader->node != (xmlNodePtr)0x0) {
    cur = reader->node;
    if (reader->curnode != (xmlNodePtr)0x0) {
      cur = reader->curnode;
    }
    xVar1 = cur->type;
    if (XML_NAMESPACE_DECL < xVar1) {
      return (xmlChar *)0x0;
    }
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) {
      return cur->content;
    }
    if (xVar1 != XML_ATTRIBUTE_NODE) {
      if (xVar1 == XML_NAMESPACE_DECL) {
        return cur->name;
      }
      return (xmlChar *)0x0;
    }
    p_Var2 = cur->children;
    if (((p_Var2 != (_xmlNode *)0x0) && (p_Var2->type == XML_TEXT_NODE)) &&
       (p_Var2->next == (_xmlNode *)0x0)) {
      return p_Var2->content;
    }
    if (reader->buffer == (xmlBufPtr)0x0) {
      pxVar4 = xmlBufCreate(0x32);
      reader->buffer = pxVar4;
      if (pxVar4 == (xmlBufPtr)0x0) {
        return (xmlChar *)0x0;
      }
    }
    else {
      xmlBufEmpty(reader->buffer);
      pxVar4 = reader->buffer;
    }
    xmlBufGetNodeContent(pxVar4,cur);
    pxVar3 = xmlBufContent(reader->buffer);
    if (pxVar3 != (xmlChar *)0x0) {
      return pxVar3;
    }
    xmlTextReaderErrMemory(reader);
    xmlBufFree(reader->buffer);
    pxVar4 = xmlBufCreate(0x32);
    reader->buffer = pxVar4;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstValue(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;

    switch (node->type) {
        case XML_NAMESPACE_DECL:
	    return(((xmlNsPtr) node)->href);
        case XML_ATTRIBUTE_NODE:{
	    xmlAttrPtr attr = (xmlAttrPtr) node;
	    const xmlChar *ret;

	    if ((attr->children != NULL) &&
	        (attr->children->type == XML_TEXT_NODE) &&
		(attr->children->next == NULL))
		return(attr->children->content);
	    else {
		if (reader->buffer == NULL) {
		    reader->buffer = xmlBufCreate(50);
                    if (reader->buffer == NULL)
                        return (NULL);
                } else
                    xmlBufEmpty(reader->buffer);
	        xmlBufGetNodeContent(reader->buffer, node);
		ret = xmlBufContent(reader->buffer);
		if (ret == NULL) {
                    xmlTextReaderErrMemory(reader);
		    /* error on the buffer best to reallocate */
		    xmlBufFree(reader->buffer);
		    reader->buffer = xmlBufCreate(50);
		}
		return(ret);
	    }
	    break;
	}
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
	    return(node->content);
	default:
	    break;
    }
    return(NULL);
}